

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O0

void __thiscall
MemPlumberInternal::freeMemory(MemPlumberInternal *this,void *pointer,char *file,int line)

{
  bool bVar1;
  ulong uVar2;
  void *actualPointerInRecord;
  new_ptr_list_t *metaDataBucketLinkedListPrevElement;
  new_ptr_list_t *metaDataBucketLinkedListElement;
  size_t hashIndex;
  int line_local;
  char *file_local;
  void *pointer_local;
  MemPlumberInternal *this_local;
  
  if (pointer != (void *)0x0) {
    uVar2 = (ulong)pointer >> 8 & 0x3fff;
    metaDataBucketLinkedListPrevElement = this->m_PointerListHashtable[uVar2];
    actualPointerInRecord = (void *)0x0;
    for (; metaDataBucketLinkedListPrevElement != (new_ptr_list_t *)0x0;
        metaDataBucketLinkedListPrevElement = metaDataBucketLinkedListPrevElement->next) {
      if (metaDataBucketLinkedListPrevElement + 1 == (new_ptr_list_t *)pointer) {
        if (actualPointerInRecord == (void *)0x0) {
          this->m_PointerListHashtable[uVar2] = metaDataBucketLinkedListPrevElement->next;
        }
        else {
          *(new_ptr_list_t **)actualPointerInRecord = metaDataBucketLinkedListPrevElement->next;
        }
        bVar1 = isVerbose(this);
        if (bVar1) {
          fprintf((FILE *)this->m_Dumper,"Free: 0x%p (size %d[bytes]) allocated in: %s:%d\n",pointer
                  ,metaDataBucketLinkedListPrevElement->size & 0xffffffff,
                  metaDataBucketLinkedListPrevElement->file,
                  (ulong)(uint)metaDataBucketLinkedListPrevElement->line);
        }
        free(metaDataBucketLinkedListPrevElement);
        return;
      }
      actualPointerInRecord = metaDataBucketLinkedListPrevElement;
    }
    bVar1 = isVerbose(this);
    if (bVar1) {
      fprintf((FILE *)this->m_Dumper,"Pointer 0x%p wasn\'t found\n",pointer);
    }
    free(pointer);
  }
  return;
}

Assistant:

void freeMemory(void* pointer, const char* file, int line) {

        if (pointer == NULL) {
            return;
        }

        // find the metadata record bucket in the hash table
        size_t hashIndex = MEMPLUMBER_HASH(pointer);
        new_ptr_list_t* metaDataBucketLinkedListElement = m_PointerListHashtable[hashIndex];
	    new_ptr_list_t* metaDataBucketLinkedListPrevElement = NULL;

        // inside the bucket, go over the linked list until you find the specific pointer
        while (metaDataBucketLinkedListElement != NULL) {

            // get the actual pointer from the record
            void* actualPointerInRecord = (char*)metaDataBucketLinkedListElement + sizeof(new_ptr_list_t);

            // if this is not the pointer we're looking for - continue the search
            if (actualPointerInRecord != pointer) {
                metaDataBucketLinkedListPrevElement = metaDataBucketLinkedListElement;
                metaDataBucketLinkedListElement = metaDataBucketLinkedListElement->next;
                continue;
            }
            else { // this is the pointer we're looking for

                // remove the current element from the linked list
                if (metaDataBucketLinkedListPrevElement == NULL) { // this is the first item in the list
                    m_PointerListHashtable[hashIndex] = metaDataBucketLinkedListElement->next;
                }
                else { // this is not the first item in the list
                    metaDataBucketLinkedListPrevElement->next = metaDataBucketLinkedListElement->next;
                }

                if (isVerbose()) {
                    fprintf(m_Dumper, "Free: 0x%p (size %d[bytes]) allocated in: %s:%d\n", 
                        pointer,
                        (int)metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file, 
                        metaDataBucketLinkedListElement->line);
                }

                // free the memory of the current item
                free(metaDataBucketLinkedListElement);

                return;
            }
        }

        // if got to here it means memory was allocated before monitoring started. Simply free the memory and return 
        if (isVerbose()) {
            fprintf(m_Dumper, "Pointer 0x%p wasn't found\n", pointer);
        }

        free(pointer);
    }